

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char[7],std::__cxx11::string,char[11],std::__cxx11::string,char[2]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [7],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [11],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [2])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  size_t local_90;
  char *pcStack_88;
  size_t local_80;
  char (*local_78) [7];
  size_type local_70;
  pointer local_68;
  size_t local_60;
  char (*local_58) [11];
  size_type local_50;
  pointer local_48;
  size_t local_40;
  char (*local_38) [2];
  
  local_a0._M_len = (a->View_)._M_len;
  local_a0._M_str = (a->View_)._M_str;
  local_90 = (b->View_)._M_len;
  pcStack_88 = (b->View_)._M_str;
  local_80 = strlen(*args);
  local_68 = (args_1->_M_dataplus)._M_p;
  local_70 = args_1->_M_string_length;
  local_78 = args;
  local_60 = strlen(*args_2);
  local_48 = (args_3->_M_dataplus)._M_p;
  local_50 = args_3->_M_string_length;
  local_58 = args_2;
  local_40 = strlen(*args_4);
  local_38 = args_4;
  views._M_len = 7;
  views._M_array = &local_a0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}